

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  SyntaxNode *pSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  Diagnostic *pDVar3;
  int *piVar4;
  byte *pbVar5;
  ulong uVar6;
  size_type __rlen;
  long lVar7;
  string_view sVar8;
  SourceRange SVar9;
  string_view arg;
  Token local_48;
  PragmaExpressionSyntax *local_38;
  
  local_48.info = keyword.info;
  local_48._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar9 = Token::range(&local_48);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pSVar1 = args[3].super_SyntaxNode.previewNode, pSVar1 != (SyntaxNode *)0x0)) {
      pbVar5 = (byte *)((long)&pSVar1->kind + 1);
      if (pbVar5 < (byte *)0x2) {
        return;
      }
      uVar6 = (ulong)pbVar5 >> 1;
      lVar7 = 0;
      local_38 = args;
      while( true ) {
        ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(local_38[3].super_SyntaxNode.parent)->kind + lVar7));
        pSVar1 = *ppSVar2;
        if (pSVar1->kind != NameValuePragmaExpression) break;
        sVar8 = Token::valueText((Token *)(pSVar1 + 1));
        piVar4 = (int *)sVar8._M_str;
        switch(sVar8._M_len) {
        case 0:
          break;
        case 4:
          if (*piVar4 != 0x74697865) goto switchD_001b731f_caseD_1;
LAB_001b741d:
          pSVar1 = pSVar1[2].parent;
          if ((pSVar1->kind != SimplePragmaExpression) ||
             ((short)pSVar1[1].kind != AcceptOnPropertyExpr)) {
            SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar1);
            pDVar3 = addDiag(this,(DiagCode)0x1f0004,SVar9);
            goto LAB_001b7453;
          }
          break;
        case 5:
          if ((char)piVar4[1] == 'y' && *piVar4 == 0x72746e65) goto LAB_001b741d;
          if ((char)piVar4[1] != 'h' || *piVar4 != 0x6374616d) goto switchD_001b731f_caseD_1;
          requireUInt32(this,(PragmaExpressionSyntax *)pSVar1[2].parent);
          break;
        case 7:
          if ((*(int *)((long)piVar4 + 3) == 0x79726172 && *piVar4 == 0x7262696c) ||
             (*(int *)((long)piVar4 + 3) == 0x65727574 && *piVar4 == 0x74616566)) goto LAB_001b741d;
        default:
switchD_001b731f_caseD_1:
          SVar9 = Token::range((Token *)(pSVar1 + 1));
          pDVar3 = addDiag(this,(DiagCode)0x2e0004,SVar9);
          arg = Token::valueText(&local_48);
          pDVar3 = Diagnostic::operator<<(pDVar3,arg);
LAB_001b7453:
          Diagnostic::operator<<(pDVar3,sVar8);
        }
        lVar7 = lVar7 + 0x30;
        uVar6 = uVar6 - 1;
        if (uVar6 == 0) {
          return;
        }
      }
      SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar1);
      pDVar3 = addDiag(this,(DiagCode)0x270004,SVar9);
      sVar8 = Token::valueText(&local_48);
      goto LAB_001b7453;
    }
    SVar9 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar3 = addDiag(this,(DiagCode)0x270004,SVar9);
  sVar8 = Token::valueText(&local_48);
  Diagnostic::operator<<(pDVar3,sVar8);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}